

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O0

void add_object(state *s,uint32_t handle,uint32_t class)

{
  rnnenum *prVar1;
  rnnenum *prVar2;
  obj *poVar3;
  rnndeccontext *prVar4;
  char *local_90;
  char *local_80;
  obj *local_78;
  char *local_70;
  obj *local_60;
  int local_4c;
  int __i_1;
  int local_40;
  int local_3c;
  int __i;
  int i;
  obj *obj;
  rnnvalue *v;
  rnnenum *cls;
  rnnenum *chs;
  uint32_t class_local;
  uint32_t handle_local;
  state *s_local;
  
  prVar1 = rnn_findenum(s->db,"chipset");
  prVar2 = rnn_findenum(s->db,"obj-class");
  if ((prVar2 != (rnnenum *)0x0) && (prVar1 != (rnnenum *)0x0)) {
    local_3c = 0;
    while( true ) {
      poVar3 = s->objects + local_3c;
      if (0xff < local_3c) {
        fprintf(_stderr,"Too many objects\n");
        return;
      }
      if (poVar3->handle == 0) break;
      local_3c = local_3c + 1;
    }
    poVar3->handle = handle;
    poVar3->class = class;
    prVar4 = rnndec_newcontext(s->db);
    poVar3->ctx = prVar4;
    poVar3->ctx->colors = s->colors;
    obj = (obj *)0x0;
    local_40 = 0;
    while ((local_40 < prVar1->valsnum &&
           (obj = (obj *)prVar1->vals[local_40], ((rnnvalue *)obj)->value != (ulong)s->chipset))) {
      local_40 = local_40 + 1;
    }
    if (obj->ctx == (rnndeccontext *)(ulong)s->chipset) {
      local_60 = obj;
    }
    else {
      local_60 = (obj *)0x0;
    }
    if (local_60 == (obj *)0x0) {
      local_70 = "NV1";
    }
    else {
      local_70 = *(char **)local_60;
    }
    rnndec_varadd(poVar3->ctx,"chipset",local_70);
    obj = (obj *)0x0;
    local_4c = 0;
    while ((local_4c < prVar2->valsnum &&
           (obj = (obj *)prVar2->vals[local_4c], ((rnnvalue *)obj)->value != (ulong)class))) {
      local_4c = local_4c + 1;
    }
    if (obj->ctx == (rnndeccontext *)(ulong)class) {
      local_78 = obj;
    }
    else {
      local_78 = (obj *)0x0;
    }
    if (local_78 == (obj *)0x0) {
      local_80 = (char *)0x0;
    }
    else {
      local_80 = *(char **)local_78;
    }
    poVar3->name = local_80;
    if (local_78 == (obj *)0x0) {
      local_90 = "NV1_NULL";
    }
    else {
      local_90 = *(char **)local_78;
    }
    rnndec_varadd(poVar3->ctx,"obj-class",local_90);
    return;
  }
  fprintf(_stderr,"No obj-class/chipset enum found\n");
  abort();
}

Assistant:

void
add_object(struct state *s, uint32_t handle, uint32_t class)
{
	struct rnnenum *chs = rnn_findenum(s->db, "chipset");
	struct rnnenum *cls = rnn_findenum(s->db, "obj-class");
	struct rnnvalue *v;
	struct obj *obj;
	int i;

	if (!cls || !chs) {
		fprintf(stderr, "No obj-class/chipset enum found\n");
		abort();
	}

	for (i = 0; obj = &s->objects[i], i < MAX_OBJECTS; i++) {
		if (!obj->handle) {
			obj->handle = handle;
			obj->class = class;
			obj->ctx = rnndec_newcontext(s->db);
			obj->ctx->colors = s->colors;

			v = NULL;
			FINDARRAY(chs->vals, v, v->value == s->chipset);
			rnndec_varadd(obj->ctx, "chipset",
				      v ? v->name : "NV1");

			v = NULL;
			FINDARRAY(cls->vals, v, v->value == class);
			obj->name = v ? v->name : NULL;
			rnndec_varadd(obj->ctx, "obj-class",
				      v ? v->name : "NV1_NULL");

			return;
		}
	}

	fprintf(stderr, "Too many objects\n");
}